

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

void mk_disj(dtree_node_t *node,uint32 clust,comp_quest_t *q,quest_t *conj,uint32 c_idx,
            uint32 *d_idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  dtree_node_t *node_00;
  int32 *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  quest_t *pqVar8;
  long lVar9;
  uint32 uVar10;
  ulong n_elem;
  
  n_elem = (ulong)c_idx;
  while( true ) {
    node_00 = node->y;
    uVar10 = (uint32)n_elem;
    if ((node_00 == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) break;
    piVar4 = (int32 *)node->q;
    conj[n_elem].ctxt = *piVar4;
    conj[n_elem].neg = piVar4[1];
    conj[n_elem].pset = piVar4[2];
    conj[n_elem].member = *(uint32 **)(piVar4 + 4);
    conj[n_elem].posn = *(uint32 **)(piVar4 + 6);
    mk_disj(node_00,clust,q,conj,uVar10 + 1,d_idx);
    conj[n_elem].neg = (uint)(conj[n_elem].neg == 0);
    node = node->n;
    n_elem = (ulong)(uVar10 + 1);
  }
  if (node->clust == clust) {
    uVar3 = *d_idx;
    q->prod_len[uVar3] = uVar10;
    pqVar8 = (quest_t *)
             __ckd_calloc__(n_elem,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                            ,0x196);
    q->conj_q[uVar3] = pqVar8;
    if (uVar10 != 0) {
      lVar9 = 0;
      do {
        pqVar8 = q->conj_q[uVar3];
        puVar1 = (undefined8 *)((long)&conj->ctxt + lVar9);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)&conj->member + lVar9);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pqVar8->member + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)&pqVar8->ctxt + lVar9);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        lVar9 = lVar9 + 0x20;
      } while (n_elem << 5 != lVar9);
    }
    *d_idx = *d_idx + 1;
  }
  return;
}

Assistant:

void
mk_disj(dtree_node_t *node,
	uint32 clust,
	comp_quest_t *q,
	quest_t *conj,
	uint32 c_idx,
	uint32 *d_idx)
{
    if (IS_LEAF(node)) {
	if (node->clust == clust) {
	    uint32 i;
	    uint32 d;

	    d = *d_idx;
	    q->prod_len[d] = c_idx;
	    q->conj_q[d] = (quest_t *)ckd_calloc(c_idx, sizeof(quest_t));
	    for (i = 0; i < c_idx; i++) {
		memcpy(&q->conj_q[d][i], &conj[i], sizeof(quest_t));
	    }

	    ++(*d_idx);
	}
	else
	    return;
    }
    else {
	quest_t *qu;

	qu = (quest_t *)node->q;

	conj[c_idx].ctxt = qu->ctxt;
	conj[c_idx].neg  = qu->neg;
	conj[c_idx].pset = qu->pset;
	conj[c_idx].member = qu->member;
	conj[c_idx].posn = qu->posn;

	mk_disj(node->y, clust, q, conj, c_idx+1, d_idx);

	conj[c_idx].neg = !conj[c_idx].neg;
	mk_disj(node->n, clust, q, conj, c_idx+1, d_idx);

	return;
    }
}